

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RX.cpp
# Opt level: O0

void __thiscall RX::~RX(RX *this)

{
  RX *this_local;
  
  if ((this->_compiled & 1U) != 0) {
    regfree((regex_t *)&this->_regex);
  }
  std::__cxx11::string::~string((string *)&this->_pattern);
  return;
}

Assistant:

RX::~RX ()
{
  if (_compiled)
    regfree (&_regex);
}